

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O2

void bigval_add(bigval *r,bigval *a,bigval *b)

{
  ulong uVar1;
  ulong uVar2;
  BignumInt BVar3;
  BignumInt BVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = b->w[1];
  uVar5 = (ulong)CARRY8(b->w[0],a->w[0]);
  uVar2 = a->w[1];
  uVar6 = uVar1 + a->w[1];
  BVar3 = b->w[2];
  BVar4 = a->w[2];
  r->w[0] = b->w[0] + a->w[0];
  r->w[1] = uVar6 + uVar5;
  r->w[2] = BVar3 + BVar4 + (ulong)(CARRY8(uVar1,uVar2) || CARRY8(uVar6,uVar5));
  return;
}

Assistant:

static void bigval_add(bigval *r, const bigval *a, const bigval *b)
{
    BignumInt v0, v1, v2, v3, v4, v5, v6, v7, v8;
    BignumCarry carry;

    v0 = a->w[0];
    v1 = a->w[1];
    v2 = a->w[2];
    v3 = b->w[0];
    v4 = b->w[1];
    v5 = b->w[2];
    BignumADC(v6, carry, v0, v3, 0);
    BignumADC(v7, carry, v1, v4, carry);
    v8 = v2 + v5 + carry;
    r->w[0] = v6;
    r->w[1] = v7;
    r->w[2] = v8;
}